

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

int libcellml::convertPrefixToInt(string *in,bool *ok)

{
  bool bVar1;
  uint in_EAX;
  const_iterator cVar2;
  uint *puVar3;
  int prefixInt;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  if (ok != (bool *)0x0) {
    *ok = true;
  }
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)standardPrefixList_abi_cxx11_,in);
  if (cVar2._M_node == (_Base_ptr)(standardPrefixList_abi_cxx11_ + 8)) {
    if (in->_M_string_length != 0) {
      bVar1 = convertToInt(in,(int *)((long)&uStack_18 + 4));
      if (ok != (bool *)0x0) {
        *ok = bVar1;
      }
    }
  }
  else {
    puVar3 = (uint *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)standardPrefixList_abi_cxx11_,in);
    uStack_18 = (ulong)*puVar3 << 0x20;
  }
  return uStack_18._4_4_;
}

Assistant:

int convertPrefixToInt(const std::string &in, bool *ok)
{
    int prefixInt = 0;

    if (ok != nullptr) {
        *ok = true;
    }

    if (isStandardPrefixName(in)) {
        prefixInt = standardPrefixList.at(in);
    } else if (!in.empty()) {
        bool success = convertToInt(in, prefixInt);
        if (ok != nullptr) {
            *ok = success;
        }
    }
    return prefixInt;
}